

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O0

void soul::Optimisations::recursivelyFlagModuleUse(Program *program,Module *m)

{
  bool bVar1;
  reference ppVar2;
  Module *m_00;
  pool_ptr<soul::Module> module;
  pool_ref<soul::heart::ProcessorInstance> processorInstance;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
  *__range2;
  Module *m_local;
  Program *program_local;
  
  m->moduleUseTestFlag = true;
  __end2 = std::
           vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
           ::begin(&m->processorInstances);
  processorInstance.object =
       (ProcessorInstance *)
       std::
       vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
       ::end(&m->processorInstances);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<soul::pool_ref<soul::heart::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>_>
                                     *)&processorInstance), bVar1) {
    ppVar2 = __gnu_cxx::
             __normal_iterator<soul::pool_ref<soul::heart::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>_>
             ::operator*(&__end2);
    module.object = (Module *)ppVar2->object;
    pool_ref<soul::heart::ProcessorInstance>::operator->
              ((pool_ref<soul::heart::ProcessorInstance> *)&module);
    Program::findModuleWithName((Program *)&stack0xffffffffffffffc0,(string *)program);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&stack0xffffffffffffffc0);
    if (bVar1) {
      m_00 = pool_ptr<soul::Module>::operator*((pool_ptr<soul::Module> *)&stack0xffffffffffffffc0);
      recursivelyFlagModuleUse(program,m_00);
    }
    pool_ptr<soul::Module>::~pool_ptr((pool_ptr<soul::Module> *)&stack0xffffffffffffffc0);
    pool_ref<soul::heart::ProcessorInstance>::~pool_ref
              ((pool_ref<soul::heart::ProcessorInstance> *)&module);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::heart::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

static void recursivelyFlagModuleUse (Program& program, Module& m)
    {
        m.moduleUseTestFlag = true;

        for (auto processorInstance : m.processorInstances)
            if (auto module = program.findModuleWithName (processorInstance->sourceName))
                recursivelyFlagModuleUse (program, *module);
    }